

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::SPFForceManager::~SPFForceManager(SPFForceManager *this)

{
  undefined8 *in_RDI;
  ForceManager *unaff_retaddr;
  Snapshot *in_stack_ffffffffffffffe0;
  Snapshot *this_00;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *this_01;
  
  *in_RDI = &PTR__SPFForceManager_00505838;
  this_01 = (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
            in_RDI[0x193];
  if (this_01 != (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x0)
  {
    Snapshot::~Snapshot(in_stack_ffffffffffffffe0);
    operator_delete(this_01,0xa98);
  }
  this_00 = (Snapshot *)in_RDI[0x194];
  if (this_00 != (Snapshot *)0x0) {
    Snapshot::~Snapshot(this_00);
    operator_delete(this_00,0xa98);
  }
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector(this_01);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector(this_01);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  std::unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_>::~unique_ptr
            ((unique_ptr<OpenMD::Thermo,_std::default_delete<OpenMD::Thermo>_> *)this_00);
  ForceManager::~ForceManager(unaff_retaddr);
  return;
}

Assistant:

SPFForceManager::~SPFForceManager() {
    delete temporarySourceSnapshot_;
    delete temporarySinkSnapshot_;
  }